

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIXIN_TypeableDeclarationSymbol.h
# Opt level: O0

void __thiscall
psy::C::MIXIN_TypeableDeclarationSymbol::MIXIN_TypeableDeclarationSymbol
          (MIXIN_TypeableDeclarationSymbol *this)

{
  MIXIN_TypeableDeclarationSymbol *this_local;
  
  this->_vptr_MIXIN_TypeableDeclarationSymbol =
       (_func_int **)&PTR__MIXIN_TypeableDeclarationSymbol_007334b8;
  return;
}

Assistant:

class PSY_C_INTERNAL_API MIXIN_TypeableDeclarationSymbol
{
public:
    virtual ~MIXIN_TypeableDeclarationSymbol() {}

    static MIXIN_TypeableDeclarationSymbol* from(DeclarationSymbol*);
    static const MIXIN_TypeableDeclarationSymbol* from(const DeclarationSymbol*);

    virtual const Type* type() const = 0;

PSY_INTERNAL:
    PSY_GRANT_INTERNAL_ACCESS(DeclarationBinder);
    PSY_GRANT_INTERNAL_ACCESS(TypeCanonicalizer);

    virtual void setType(const Type* ty) = 0;
}